

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O1

void sylvan_gc_WRAP(WorkerP *w,Task *__dq_head,TD_sylvan_gc *t)

{
  bool bVar1;
  Task TStack_48;
  
  if (gc_enabled == '\0') {
    LOCK();
    bVar1 = gc == 0;
    if (bVar1) {
      gc = 1;
    }
    UNLOCK();
    if (!bVar1) {
      do {
      } while (lace_newframe.t == (Task *)0x0);
      lace_yield(w,__dq_head);
      return;
    }
    TStack_48.f = sylvan_gc_go_WRAP;
    TStack_48.thief._M_b._M_p = (__base_type)(__pointer_type)0x1;
    lace_run_newframe(&TStack_48);
    LOCK();
    gc = 0;
    UNLOCK();
  }
  return;
}

Assistant:

VOID_TASK_IMPL_0(sylvan_gc)
{
    if (gc_enabled) {
        int zero = 0;
        if (atomic_compare_exchange_strong(&gc, &zero, 1)) {
            NEWFRAME(sylvan_gc_go);
            gc = 0;
        } else {
            /* wait for new frame to appear */
            while (atomic_load_explicit(&lace_newframe.t, memory_order_relaxed) == 0) {}
            lace_yield(__lace_worker, __lace_dq_head);
        }
    }
}